

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_read_record_layer(mbedtls_ssl_context *ssl)

{
  byte bVar1;
  ulong uVar2;
  mbedtls_ssl_config *pmVar3;
  byte *pbVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  ushort uVar13;
  size_t __n;
  uchar *puVar14;
  uint uVar15;
  size_t *psVar16;
  
  uVar2 = ssl->in_hslen;
  if (uVar2 == 0) {
    if (ssl->in_offt != (uchar *)0x0) {
      return 0;
    }
    psVar16 = &ssl->in_msglen;
  }
  else {
    if (ssl->in_offt != (uchar *)0x0) {
      return -0x6c00;
    }
    psVar16 = &ssl->in_hslen;
    __n = ssl->in_msglen - uVar2;
    if (ssl->in_msglen < uVar2 || __n == 0) {
      ssl->in_msglen = 0;
    }
    else {
      ssl->in_msglen = __n;
      memmove(ssl->in_msg,ssl->in_msg + uVar2,__n);
    }
  }
  *psVar16 = 0;
  if (ssl->in_msglen != 0) {
    return 0;
  }
  iVar7 = mbedtls_ssl_fetch_input(ssl,(ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5);
  if (iVar7 != 0) {
    return iVar7;
  }
  pmVar3 = ssl->conf;
  pbVar4 = ssl->in_hdr;
  bVar1 = *pbVar4;
  ssl->in_msgtype = (uint)bVar1;
  puVar14 = (uchar *)(ulong)(ushort)(*(ushort *)ssl->in_len << 8 | *(ushort *)ssl->in_len >> 8);
  ssl->in_msglen = (size_t)puVar14;
  uVar8 = *(uint *)&pmVar3->field_0x174;
  uVar11 = (uint)pbVar4[1];
  if ((uVar8 & 2) == 0) {
    uVar15 = (uint)pbVar4[2];
  }
  else {
    uVar11 = (byte)~pbVar4[1] + 2;
    uVar15 = 2;
    if (pbVar4[2] != 0xff) {
      uVar15 = (pbVar4[2] ^ 0xff) + 1;
    }
  }
  if ((bVar1 & 0xfffffffc) == 0x14) {
    if (((uVar11 == ssl->major_ver) && (uVar15 <= pmVar3->max_minor_ver)) &&
       (puVar14 <= ssl->in_buf + (0x414d - (long)ssl->in_msg))) {
      if ((uVar8 & 2) != 0) {
        uVar13 = *(ushort *)ssl->in_ctr << 8 | *(ushort *)ssl->in_ctr >> 8;
        if (uVar13 == ssl->in_epoch) {
          iVar9 = mbedtls_ssl_dtls_replay_check(ssl);
          iVar7 = -0x6700;
          if (iVar9 != 0) goto LAB_00113a5e;
          if (bVar1 == 0x17) {
            if ((ssl->state != 0x10) &&
               ((bVar6 = false, ssl->state != 2 || (ssl->renego_status != 1)))) goto LAB_00113a60;
          }
          else if ((bVar1 == 0x14) && ((ssl->state != 0xc && (ssl->state != 10))))
          goto LAB_00113a5e;
          bVar6 = true;
        }
        else {
          iVar7 = -0x6700;
          if ((uVar8 & 1) != 0) {
            bVar6 = false;
            if (((uVar13 != 0) || (ssl->state != 0x10)) || (bVar1 != 0x16)) goto LAB_00113a60;
            if ((0xd < ssl->in_left) && (ssl->in_buf[0xd] == '\x01')) {
              iVar7 = ssl_handle_possible_reconnect(ssl);
            }
          }
LAB_00113a5e:
          bVar6 = false;
        }
LAB_00113a60:
        if (!bVar6) goto LAB_0011386e;
      }
      uVar2 = ssl->in_msglen;
      if (ssl->transform_in == (mbedtls_ssl_transform *)0x0) {
        iVar7 = -0x7200;
        if (0xffffffffffffbfff < uVar2 - 0x4001) {
LAB_00113abb:
          iVar7 = 0;
        }
      }
      else {
        uVar5 = ssl->transform_in->minlen;
        if (uVar2 < uVar5) goto LAB_0011381a;
        if ((uVar2 <= uVar5 + 0x4100) || (iVar7 = -0x7200, ssl->minor_ver < 1)) goto LAB_00113abb;
      }
    }
    else {
LAB_0011381a:
      iVar7 = -0x7200;
    }
  }
  else {
    iVar7 = -0x7200;
    if (((uVar8 & 2) == 0) &&
       (pmVar3 != (mbedtls_ssl_config *)0x0 && ssl != (mbedtls_ssl_context *)0x0)) {
      ssl->out_msgtype = 0x15;
      ssl->out_msglen = 2;
      *ssl->out_msg = '\x02';
      ssl->out_msg[1] = '\n';
      mbedtls_ssl_write_record(ssl);
    }
  }
LAB_0011386e:
  uVar8 = *(uint *)&ssl->conf->field_0x174;
  if (iVar7 == 0) {
    iVar7 = mbedtls_ssl_fetch_input(ssl,ssl->in_msglen + (ulong)(uVar8 & 2) * 4 + 5);
    if (iVar7 != 0) {
      return iVar7;
    }
    if ((ssl->conf->field_0x174 & 2) == 0) {
      lVar10 = 0xe8;
      lVar12 = 0;
    }
    else {
      lVar12 = ssl->in_msglen + 0xd;
      lVar10 = 0xf8;
    }
    *(long *)((long)&ssl->conf + lVar10) = lVar12;
    uVar8 = ssl_prepare_record_content(ssl);
    if (uVar8 == 0) {
      return 0;
    }
    pmVar3 = ssl->conf;
    if ((pmVar3->field_0x174 & 2) != 0) {
      if ((uVar8 | 0x80) != 0xffff8e80) {
        return uVar8;
      }
      if ((ssl->state != 0xd) && (ssl->state != 0xb)) {
        uVar8 = pmVar3->badmac_limit;
        if ((uVar8 != 0) &&
           (uVar11 = ssl->badmac_seen + 1, ssl->badmac_seen = uVar11, uVar8 <= uVar11)) {
          return -0x7180;
        }
        goto LAB_00113a31;
      }
    }
    if (pmVar3 != (mbedtls_ssl_config *)0x0 && uVar8 == 0xffff8e80) {
      ssl->out_msgtype = 0x15;
      ssl->out_msglen = 2;
      *ssl->out_msg = '\x02';
      ssl->out_msg[1] = '\x14';
      mbedtls_ssl_write_record(ssl);
      return uVar8;
    }
    return uVar8;
  }
  if (iVar7 == -0x6780 || (uVar8 & 2) == 0) {
    return iVar7;
  }
  if (iVar7 == -0x6700) {
    ssl->next_record_offset = ssl->in_msglen + 0xd;
    return -0x6580;
  }
LAB_00113a31:
  ssl->next_record_offset = 0;
  ssl->in_left = 0;
  return -0x6580;
}

Assistant:

int mbedtls_ssl_read_record_layer( mbedtls_ssl_context *ssl )
{
    int ret;

    /*
     * Step A
     *
     * Consume last content-layer message and potentially
     * update in_msglen which keeps track of the contents'
     * consumption state.
     *
     * (1) Handshake messages:
     *     Remove last handshake message, move content
     *     and adapt in_msglen.
     *
     * (2) Alert messages:
     *     Consume whole record content, in_msglen = 0.
     *
     * (3) Change cipher spec:
     *     Consume whole record content, in_msglen = 0.
     *
     * (4) Application data:
     *     Don't do anything - the record layer provides
     *     the application data as a stream transport
     *     and consumes through mbedtls_ssl_read only.
     *
     */

    /* Case (1): Handshake messages */
    if( ssl->in_hslen != 0 )
    {
        /* Hard assertion to be sure that no application data
         * is in flight, as corrupting ssl->in_msglen during
         * ssl->in_offt != NULL is fatal. */
        if( ssl->in_offt != NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        /*
         * Get next Handshake message in the current record
         */

        /* Notes:
         * (1) in_hslen is not necessarily the size of the
         *     current handshake content: If DTLS handshake
         *     fragmentation is used, that's the fragment
         *     size instead. Using the total handshake message
         *     size here is faulty and should be changed at
         *     some point.
         * (2) While it doesn't seem to cause problems, one
         *     has to be very careful not to assume that in_hslen
         *     is always <= in_msglen in a sensible communication.
         *     Again, it's wrong for DTLS handshake fragmentation.
         *     The following check is therefore mandatory, and
         *     should not be treated as a silently corrected assertion.
         *     Additionally, ssl->in_hslen might be arbitrarily out of
         *     bounds after handling a DTLS message with an unexpected
         *     sequence number, see mbedtls_ssl_prepare_handshake_record.
         */
        if( ssl->in_hslen < ssl->in_msglen )
        {
            ssl->in_msglen -= ssl->in_hslen;
            memmove( ssl->in_msg, ssl->in_msg + ssl->in_hslen,
                     ssl->in_msglen );

            MBEDTLS_SSL_DEBUG_BUF( 4, "remaining content in record",
                                   ssl->in_msg, ssl->in_msglen );
        }
        else
        {
            ssl->in_msglen = 0;
        }

        ssl->in_hslen   = 0;
    }
    /* Case (4): Application data */
    else if( ssl->in_offt != NULL )
    {
        return( 0 );
    }
    /* Everything else (CCS & Alerts) */
    else
    {
        ssl->in_msglen = 0;
    }

    /*
     * Step B
     *
     * Fetch and decode new record if current one is fully consumed.
     *
     */

    if( ssl->in_msglen > 0 )
    {
        /* There's something left to be processed in the current record. */
        return( 0 );
    }

    /* Current record either fully processed or to be discarded. */

    if( ( ret = mbedtls_ssl_fetch_input( ssl, mbedtls_ssl_hdr_len( ssl ) ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_fetch_input", ret );
        return( ret );
    }

    if( ( ret = ssl_parse_record_header( ssl ) ) != 0 )
    {
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
            ret != MBEDTLS_ERR_SSL_CLIENT_RECONNECT )
        {
            if( ret == MBEDTLS_ERR_SSL_UNEXPECTED_RECORD )
            {
                /* Skip unexpected record (but not whole datagram) */
                ssl->next_record_offset = ssl->in_msglen
                                        + mbedtls_ssl_hdr_len( ssl );

                MBEDTLS_SSL_DEBUG_MSG( 1, ( "discarding unexpected record "
                                            "(header)" ) );
            }
            else
            {
                /* Skip invalid record and the rest of the datagram */
                ssl->next_record_offset = 0;
                ssl->in_left = 0;

                MBEDTLS_SSL_DEBUG_MSG( 1, ( "discarding invalid record "
                                            "(header)" ) );
            }

            /* Get next record */
            return( MBEDTLS_ERR_SSL_CONTINUE_PROCESSING );
        }
#endif
        return( ret );
    }

    /*
     * Read and optionally decrypt the message contents
     */
    if( ( ret = mbedtls_ssl_fetch_input( ssl,
                                 mbedtls_ssl_hdr_len( ssl ) + ssl->in_msglen ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_fetch_input", ret );
        return( ret );
    }

    /* Done reading this record, get ready for the next one */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        ssl->next_record_offset = ssl->in_msglen + mbedtls_ssl_hdr_len( ssl );
        if( ssl->next_record_offset < ssl->in_left )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "more than one record within datagram" ) );
        }
    }
    else
#endif
        ssl->in_left = 0;

    if( ( ret = ssl_prepare_record_content( ssl ) ) != 0 )
    {
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        {
            /* Silently discard invalid records */
            if( ret == MBEDTLS_ERR_SSL_INVALID_RECORD ||
                ret == MBEDTLS_ERR_SSL_INVALID_MAC )
            {
                /* Except when waiting for Finished as a bad mac here
                 * probably means something went wrong in the handshake
                 * (eg wrong psk used, mitm downgrade attempt, etc.) */
                if( ssl->state == MBEDTLS_SSL_CLIENT_FINISHED ||
                    ssl->state == MBEDTLS_SSL_SERVER_FINISHED )
                {
#if defined(MBEDTLS_SSL_ALL_ALERT_MESSAGES)
                    if( ret == MBEDTLS_ERR_SSL_INVALID_MAC )
                    {
                        mbedtls_ssl_send_alert_message( ssl,
                                MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                MBEDTLS_SSL_ALERT_MSG_BAD_RECORD_MAC );
                    }
#endif
                    return( ret );
                }

#if defined(MBEDTLS_SSL_DTLS_BADMAC_LIMIT)
                if( ssl->conf->badmac_limit != 0 &&
                    ++ssl->badmac_seen >= ssl->conf->badmac_limit )
                {
                    MBEDTLS_SSL_DEBUG_MSG( 1, ( "too many records with bad MAC" ) );
                    return( MBEDTLS_ERR_SSL_INVALID_MAC );
                }
#endif

                /* As above, invalid records cause
                 * dismissal of the whole datagram. */

                ssl->next_record_offset = 0;
                ssl->in_left = 0;

                MBEDTLS_SSL_DEBUG_MSG( 1, ( "discarding invalid record (mac)" ) );
                return( MBEDTLS_ERR_SSL_CONTINUE_PROCESSING );
            }

            return( ret );
        }
        else
#endif
        {
            /* Error out (and send alert) on invalid records */
#if defined(MBEDTLS_SSL_ALL_ALERT_MESSAGES)
            if( ret == MBEDTLS_ERR_SSL_INVALID_MAC )
            {
                mbedtls_ssl_send_alert_message( ssl,
                        MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                        MBEDTLS_SSL_ALERT_MSG_BAD_RECORD_MAC );
            }
#endif
            return( ret );
        }
    }

    return( 0 );
}